

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcExtrudedAreaSolid *in;
  
  in = (IfcExtrudedAreaSolid *)operator_new(0x88);
  *(undefined ***)&in->field_0x70 = &PTR__Object_00806870;
  *(undefined8 *)&in->field_0x78 = 0;
  *(char **)&in->field_0x80 = "IfcExtrudedAreaSolid";
  Assimp::IFC::Schema_2x3::IfcSweptAreaSolid::IfcSweptAreaSolid
            ((IfcSweptAreaSolid *)in,&PTR_construction_vtable_24__008773b0);
  *(undefined8 *)&(in->super_IfcSweptAreaSolid).field_0x58 = 0;
  *(undefined8 *)&(in->super_IfcSweptAreaSolid).field_0x60 = 0;
  (in->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcExtrudedAreaSolid_008772d0;
  *(undefined ***)&in->field_0x70 = &PTR__IfcExtrudedAreaSolid_00877398;
  *(undefined ***)
   &(in->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcExtrudedAreaSolid_008772f8;
  *(undefined ***)
   &(in->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcExtrudedAreaSolid_00877320;
  *(undefined ***)
   &(in->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = &PTR__IfcExtrudedAreaSolid_00877348;
  *(undefined ***)&(in->super_IfcSweptAreaSolid).field_0x50 = &PTR__IfcExtrudedAreaSolid_00877370;
  GenericFill<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcSweptAreaSolid).super_IfcSolidModel.
                 super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcSweptAreaSolid).super_IfcSolidModel.
               super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }